

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

void zsat_solver_restart_seed(sat_solver *s,double seed)

{
  int **ppiVar1;
  veci *pvVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int in_R8D;
  clause *pcVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  long lVar12;
  
  (s->Mem).nEntries[0] = 0;
  (s->Mem).nEntries[1] = 0;
  (s->Mem).iPage[0] = 0;
  (s->Mem).iPage[1] = 1;
  ppiVar1 = (s->Mem).pPages;
  **ppiVar1 = 2;
  *ppiVar1[1] = 2;
  s->hLearnts = -1;
  pcVar8 = (clause *)0x0;
  uVar4 = Sat_MemAppend(&s->Mem,(int *)0x0,2,0,in_R8D);
  s->hBinary = uVar4;
  if (uVar4 != 0) {
    uVar5 = (s->Mem).uPageMask & uVar4;
    if (uVar5 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    pcVar8 = (clause *)
             ((s->Mem).pPages[(int)uVar4 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar5);
  }
  s->binary = pcVar8;
  if ((-1 < (s->trail_lim).size) && ((s->trail_lim).size = 0, -1 < (s->order).size)) {
    (s->order).size = 0;
    auVar3 = _DAT_0094e250;
    if (0 < s->size) {
      pvVar2 = s->wlists;
      uVar4 = s->size * 2;
      uVar6 = 1;
      if (1 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      lVar7 = uVar6 - 1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar9 = auVar9 ^ _DAT_0094e250;
      auVar11 = _DAT_0094f530;
      auVar13 = _DAT_0094e240;
      do {
        auVar14 = auVar13 ^ auVar3;
        iVar10 = auVar9._4_4_;
        if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ ||
                    iVar10 < auVar14._4_4_) & 1)) {
          *(undefined4 *)((long)&pvVar2->size + lVar7) = 0;
        }
        if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
            auVar14._12_4_ <= auVar9._12_4_) {
          *(undefined4 *)((long)&pvVar2[1].size + lVar7) = 0;
        }
        auVar14 = auVar11 ^ auVar3;
        iVar15 = auVar14._4_4_;
        if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
          *(undefined4 *)((long)&pvVar2[2].size + lVar7) = 0;
          *(undefined4 *)((long)&pvVar2[3].size + lVar7) = 0;
        }
        lVar12 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar12 + 4;
        lVar12 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 4;
        auVar11._8_8_ = lVar12 + 4;
        lVar7 = lVar7 + 0x40;
      } while ((ulong)((int)uVar6 + 3U & 0xfffffffc) << 4 != lVar7);
    }
    s->nDBreduces = 0;
    s->size = 0;
    s->qhead = 0;
    s->qtail = 0;
    s->VarActType = 0;
    s->ClaActType = 0;
    s->var_inc = 0x20;
    s->var_decay = 0xffffffffffffffff;
    s->cla_inc = 0x800;
    s->cla_decay = 0xffffffff;
    if (-1 < (s->act_clas).size) {
      (s->act_clas).size = 0;
      s->root_level = 0;
      s->random_seed = seed;
      s->progress_estimate = 0.0;
      s->verbosity = 0;
      (s->stats).starts = 0;
      (s->stats).clauses = 0;
      (s->stats).learnts = 0;
      (s->stats).decisions = 0;
      (s->stats).propagations = 0;
      (s->stats).inspects = 0;
      (s->stats).conflicts = 0;
      (s->stats).clauses_literals = 0;
      (s->stats).learnts_literals = 0;
      (s->stats).tot_literals = 0;
      return;
    }
  }
  __assert_fail("k <= v->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                ,0x30,"void veci_resize(veci *, int)");
}

Assistant:

void zsat_solver_restart_seed( sat_solver* s, double seed )
{
    int i;
    Sat_MemRestart( &s->Mem );
    s->hLearnts = -1;
    s->hBinary = Sat_MemAppend( &s->Mem, NULL, 2, 0, 0 );
    s->binary = clause_read( s, s->hBinary );

    veci_resize(&s->trail_lim, 0);
    veci_resize(&s->order, 0);
    for ( i = 0; i < s->size*2; i++ )
        s->wlists[i].size = 0;

    s->nDBreduces = 0;

    // initialize other vars
    s->size                   = 0;
//    s->cap                    = 0;
    s->qhead                  = 0;
    s->qtail                  = 0;

    solver_init_activities(s);
    veci_resize(&s->act_clas, 0);

    s->root_level             = 0;
//    s->simpdb_assigns         = 0;
//    s->simpdb_props           = 0;
    s->random_seed            = seed;
    s->progress_estimate      = 0;
    s->verbosity              = 0;

    s->stats.starts           = 0;
    s->stats.decisions        = 0;
    s->stats.propagations     = 0;
    s->stats.inspects         = 0;
    s->stats.conflicts        = 0;
    s->stats.clauses          = 0;
    s->stats.clauses_literals = 0;
    s->stats.learnts          = 0;
    s->stats.learnts_literals = 0;
    s->stats.tot_literals     = 0;
}